

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::queryPipelineState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLuint pipeline,
               GLenum pname,QueriedState *state)

{
  bool bVar1;
  StateQueryMemoryWriteGuard<int> value;
  StateQueryMemoryWriteGuard<int> local_24;
  
  if (type == QUERY_PIPELINE_INTEGER) {
    local_24.m_preguard = -0x21212122;
    local_24.m_value = -0x21212122;
    local_24.m_postguard = -0x21212122;
    glu::CallLogWrapper::glGetProgramPipelineiv(gl,pipeline,pname,&local_24.m_value);
    bVar1 = checkError(result,gl,"glGetProgramiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity(&local_24,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER;
      (state->m_v).vInt = local_24.m_value;
    }
  }
  return;
}

Assistant:

void queryPipelineState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLuint pipeline, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_PIPELINE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetProgramPipelineiv(pipeline, pname, &value);

			if (!checkError(result, gl, "glGetProgramiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}